

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.h
# Opt level: O0

plain_range_sorted<CGlyphIndex>
find_binary<plain_range_sorted<CGlyphIndex>,CGlyphIndex>
          (plain_range_sorted<CGlyphIndex> range,CGlyphIndex value)

{
  long lVar1;
  plain_range<CGlyphIndex> pVar2;
  CGlyphIndex value_00;
  CGlyphIndex *pCVar3;
  bool bVar4;
  CGlyphIndex *pCVar5;
  CGlyphIndex *in_RCX;
  CGlyph *in_RDX;
  CGlyphIndex *in_RDI;
  long in_FS_OFFSET;
  plain_range_sorted<CGlyphIndex> pVar6;
  plain_range<CGlyphIndex> *in_stack_ffffffffffffff90;
  CGlyphIndex *local_48;
  undefined8 in_stack_ffffffffffffffc0;
  CGlyphIndex *local_18;
  CGlyphIndex *local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pVar6.super_plain_range<CGlyphIndex>.end = in_RDI;
  pVar6.super_plain_range<CGlyphIndex>.begin = in_RCX;
  value_00.m_pGlyph = in_RDX;
  value_00._0_8_ = in_stack_ffffffffffffffc0;
  pVar6 = partition_binary<plain_range_sorted<CGlyphIndex>,CGlyphIndex>(pVar6,value_00);
  local_48 = pVar6.super_plain_range<CGlyphIndex>.begin;
  bVar4 = plain_range<CGlyphIndex>::empty((plain_range<CGlyphIndex> *)&stack0xffffffffffffffd8);
  pCVar5 = local_48;
  pCVar3 = pVar6.super_plain_range<CGlyphIndex>.end;
  if (!bVar4) {
    pCVar5 = plain_range<CGlyphIndex>::front(in_stack_ffffffffffffff90);
    bVar4 = operator==(pCVar5,(CGlyphIndex *)&stack0xffffffffffffffc8);
    pCVar5 = local_48;
    if (!bVar4) {
      plain_range_sorted<CGlyphIndex>::plain_range_sorted
                ((plain_range_sorted<CGlyphIndex> *)0x14503c);
      pCVar5 = local_18;
      pCVar3 = local_10;
    }
  }
  local_10 = pCVar3;
  local_18 = pCVar5;
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  pVar2.end = local_10;
  pVar2.begin = local_18;
  return (plain_range_sorted<CGlyphIndex>)pVar2;
}

Assistant:

R find_binary(R range, T value)
{
	range = partition_binary(range, value);
	if(range.empty()) return range;
	if(range.front() == value) return range;
	return R();
}